

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  secp256k1_gej *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t last_i;
  size_t i;
  secp256k1_fe u;
  secp256k1_gej *psVar1;
  secp256k1_gej *psVar2;
  undefined1 local_48 [48];
  secp256k1_gej *local_18;
  long local_10;
  long local_8;
  
  psVar1 = (secp256k1_gej *)0xffffffffffffffff;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (psVar2 = (secp256k1_gej *)0x0; psVar2 < local_18;
      psVar2 = (secp256k1_gej *)((long)(psVar2->x).n + 1)) {
    secp256k1_gej_verify(psVar2);
  }
  for (psVar2 = (secp256k1_gej *)0x0; psVar2 < local_18;
      psVar2 = (secp256k1_gej *)((long)(psVar2->x).n + 1)) {
    if (*(int *)(local_10 + (long)psVar2 * 0x98 + 0x90) == 0) {
      if (psVar1 == (secp256k1_gej *)0xffffffffffffffff) {
        psVar1 = psVar2;
        memcpy((void *)(local_8 + (long)psVar2 * 0x68),
               (void *)(local_10 + (long)psVar2 * 0x98 + 0x60),0x30);
        psVar2 = psVar1;
      }
      else {
        secp256k1_fe_mul(&psVar2->x,&psVar1->x,(secp256k1_fe *)0x1432b9);
        psVar1 = psVar2;
        psVar2 = psVar1;
      }
    }
    else {
      secp256k1_ge_set_infinity((secp256k1_ge *)0x14324c);
    }
  }
  if (psVar1 != (secp256k1_gej *)0xffffffffffffffff) {
    secp256k1_fe_inv_var(&psVar2->x,&psVar1->x);
    psVar2 = psVar1;
    while (psVar2 != (secp256k1_gej *)0x0) {
      psVar2 = (secp256k1_gej *)&psVar2[-1].field_0x97;
      if (*(int *)(local_10 + (long)psVar2 * 0x98 + 0x90) == 0) {
        secp256k1_fe_mul((secp256k1_fe *)psVar2,&psVar1->x,(secp256k1_fe *)0x143358);
        secp256k1_fe_mul(&psVar2->x,&psVar1->x,(secp256k1_fe *)0x143379);
        psVar1 = psVar2;
        psVar2 = psVar1;
      }
    }
    if (*(int *)(local_10 + (long)psVar1 * 0x98 + 0x90) != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/group_impl.h"
              ,0xeb,"test condition failed: !a[last_i].infinity");
      abort();
    }
    memcpy((void *)(local_8 + (long)psVar1 * 0x68),local_48,0x30);
    for (psVar1 = (secp256k1_gej *)0x0; psVar1 < local_18;
        psVar1 = (secp256k1_gej *)((long)(psVar1->x).n + 1)) {
      if (*(int *)(local_10 + (long)psVar1 * 0x98 + 0x90) == 0) {
        secp256k1_ge_set_gej_zinv((secp256k1_ge *)u.n[0],(secp256k1_gej *)i,(secp256k1_fe *)last_i);
      }
    }
    for (psVar1 = (secp256k1_gej *)0x0; psVar1 < local_18;
        psVar1 = (secp256k1_gej *)((long)(psVar1->x).n + 1)) {
      secp256k1_ge_verify((secp256k1_ge *)psVar1);
    }
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
    }
#endif

    for (i = 0; i < len; i++) {
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}